

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O3

void __thiscall
geemuboi::test::core::CpuTest::verify_ld_r16_d16
          (CpuTest *this,uint8_t instruction,Registers *expected_regs)

{
  FunctionMocker<unsigned_short_(unsigned_short)> *this_00;
  undefined2 uVar1;
  bool bVar2;
  TypedExpectation<unsigned_short_(unsigned_short)> *this_01;
  char *message;
  AssertionResult gtest_ar;
  Matcher<unsigned_short> local_b0;
  MockSpec<unsigned_short_(unsigned_short)> local_98;
  undefined1 local_78 [16];
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  linked_ptr<testing::ActionInterface<unsigned_short_(unsigned_short)>_> local_58;
  linked_ptr<int> local_40;
  
  (this->regs).f = 0xf0;
  uVar1 = (this->regs).pc;
  testing::Matcher<unsigned_short>::Matcher(&local_b0,uVar1 + 1);
  this_00 = &(this->mmu).gmock1_read_word_11;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&this->mmu);
  testing::internal::FunctionMocker<unsigned_short_(unsigned_short)>::With
            (&local_98,this_00,&local_b0);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<unsigned_short_(unsigned_short)>::InternalExpectedAt
                      (&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
                       ,0x32,"mmu","read_word(regs.pc + 1)");
  local_40.value_ = (int *)operator_new(4);
  *local_40.value_ = 0x3344;
  local_40.link_.next_ = &local_40.link_;
  local_58.value_ = (ActionInterface<unsigned_short_(unsigned_short)> *)operator_new(0x10);
  (local_58.value_)->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001afb60;
  *(undefined4 *)&local_58.value_[1]._vptr_ActionInterface = 0x3344;
  *(undefined2 *)((long)&local_58.value_[1]._vptr_ActionInterface + 4) = 0x3344;
  local_58.link_.next_ = &local_58.link_;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_8_ = (undefined8 *)0x0;
  testing::internal::TypedExpectation<unsigned_short_(unsigned_short)>::WillOnce
            (this_01,(Action<unsigned_short_(unsigned_short)> *)local_78);
  testing::internal::linked_ptr<testing::ActionInterface<unsigned_short_(unsigned_short)>_>::
  ~linked_ptr(&local_58);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
  }
  testing::internal::linked_ptr<int>::depart(&local_40);
  local_98.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001acdc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_98.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
               super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
               super_MatcherBase<unsigned_short>.impl_);
  local_b0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001acdc8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::
  ~linked_ptr(&local_b0.super_MatcherBase<unsigned_short>.impl_);
  execute_instruction(this,instruction);
  expected_regs->f = 0xf0;
  expected_regs->pc = 3;
  verify_state_changes(this,expected_regs);
  local_98.function_mocker_._0_4_ =
       (*((this->cpu)._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_b0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)CONCAT44(local_b0.super_MatcherBase<unsigned_short>._vptr_MatcherBase._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_78,"cpu->get_cycles_executed()","3",(uint *)&local_98,
             (int *)&local_b0);
  if (local_78[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    if ((undefined8 *)local_78._8_8_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_78._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (CONCAT44(local_98.function_mocker_._4_4_,(int)local_98.function_mocker_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_98.function_mocker_._4_4_,(int)local_98.function_mocker_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_98.function_mocker_._4_4_,
                                       (int)local_98.function_mocker_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_78 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void verify_ld_r16_d16(uint8_t instruction, ICpu::Registers& expected_regs) {
        regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;

        EXPECT_CALL(mmu, read_word(regs.pc + 1)).WillOnce(Return(0x3344));
        execute_instruction(instruction);

        expected_regs.f = ICpu::C_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::Z_FLAG;
        expected_regs.pc = 3;
        verify_state_changes(expected_regs);

        EXPECT_EQ(cpu->get_cycles_executed(), 3);
    }